

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
::dx(FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  Fad<double> *pFVar3;
  FadExpr<FadFuncExp<Fad<double>_>_> *pFVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  
  pFVar3 = (((this->left_->fadexpr_).expr_)->fadexpr_).expr_.fadexpr_.expr_;
  pdVar5 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar5 = (pFVar3->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar5;
  dVar6 = exp(-pFVar3->val_);
  pFVar4 = this->right_;
  pdVar5 = &(pFVar4->fadexpr_).expr_.defaultVal;
  if ((pFVar4->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar5 = (pFVar4->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar2 = *pdVar5;
  dVar7 = exp((pFVar4->fadexpr_).expr_.val_);
  return dVar7 * dVar2 + dVar6 * dVar1;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}